

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalEffects.cpp
# Opt level: O3

void __thiscall wasm::GenerateGlobalEffects::run(GenerateGlobalEffects *this,Module *module)

{
  char **__return_storage_ptr__;
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pair<wasm::Name,_wasm::Name> item;
  pair<wasm::Name,_wasm::Name> item_00;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __hashtable *__h;
  _Rb_tree_node_base *p_Var5;
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *p_Var6;
  size_type sVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Hash_node_base *p_Var11;
  undefined1 local_1d0 [8];
  unordered_map<wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
  callers;
  UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> work;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8 [8];
  ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Module *module_local;
  Name calledByCalled;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  string_view local_48;
  
  local_c8._8_8_ = &analysis.field_0x30;
  local_b0 = std::
             _Function_handler<void_(wasm::Function_*,_FuncInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalEffects.cpp:45:16)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(wasm::Function_*,_FuncInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalEffects.cpp:45:16)>
             ::_M_manager;
  local_c8._M_unused._M_object = this;
  analysis._48_8_ = module;
  wasm::ModuleUtils::
  ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
  ParallelFunctionAnalysis
            ((ParallelFunctionAnalysis<FuncInfo,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
              *)local_a8,module,(Func *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  local_1d0 = (undefined1  [8])&callers._M_h._M_rehash_policy._M_next_resize;
  callers._M_h._M_buckets = (__buckets_ptr)0x1;
  callers._M_h._M_bucket_count = 0;
  callers._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  callers._M_h._M_element_count._0_4_ = 0x3f800000;
  callers._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  callers._M_h._M_rehash_policy._4_4_ = 0;
  callers._M_h._M_rehash_policy._M_next_resize = 0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  callers._M_h._M_single_bucket = (__node_base_ptr)0x0;
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                       *)&callers._M_h._M_single_bucket,0);
  work.data.c.
  super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       (_Map_pointer)&work.count._M_h._M_rehash_policy._M_next_resize;
  work.count._M_h._M_buckets = (__buckets_ptr)0x1;
  work.count._M_h._M_bucket_count = 0;
  work.count._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  work.count._M_h._M_element_count._0_4_ = 0x3f800000;
  work.count._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  work.count._M_h._M_rehash_policy._4_4_ = 0;
  work.count._M_h._M_rehash_policy._M_next_resize = 0;
  if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
    p_Var5 = (_Rb_tree_node_base *)analysis._24_8_;
    do {
      p_Var10 = p_Var5 + 0xd;
      while (p_Var10 = *(_Rb_tree_node_base **)p_Var10, p_Var10 != (_Rb_tree_node_base *)0x0) {
        local_f8 = SUB84(p_Var10->_M_parent,0);
        uStack_f4 = (undefined4)((ulong)p_Var10->_M_parent >> 0x20);
        uStack_f0 = SUB84(p_Var10->_M_left,0);
        uStack_ec = (undefined4)((ulong)p_Var10->_M_left >> 0x20);
        item.second.super_IString.str._M_len._0_4_ = local_f8;
        item.first.super_IString.str = (IString)(IString)**(undefined1 (**) [16])(p_Var5 + 1);
        item.second.super_IString.str._M_len._4_4_ = uStack_f4;
        item.second.super_IString.str._M_str._0_4_ = uStack_f0;
        item.second.super_IString.str._M_str._4_4_ = uStack_ec;
        UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
                  ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)
                   &callers._M_h._M_single_bucket,item);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)&analysis.field_0x8);
  }
  __return_storage_ptr__ = &calledByCalled.super_IString.str._M_str;
  while( true ) {
    if (((long)((long)work.data.c.
                      super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first -
               work.data.c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_map_size) >> 5) +
        ((long)work.data.c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node -
         (long)work.data.c.
               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur >> 5) +
        ((((ulong)((long)work.data.c.
                         super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_last -
                  (long)work.data.c.
                        super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last) >> 3) - 1) +
        (ulong)(work.data.c.
                super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last == (_Elt_pointer)0x0)) * 0x10 == 0
       ) {
      if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
        p_Var5 = (_Rb_tree_node_base *)analysis._24_8_;
        do {
          p_Var6 = &std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_1d0,*(key_type **)(p_Var5 + 1))->_M_h;
          sVar7 = std::
                  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::count(p_Var6,*(key_type **)(p_Var5 + 1));
          if ((sVar7 != 0) && (*(char *)&p_Var5[0xc]._M_parent == '\x01')) {
            *(undefined1 *)&p_Var5[8]._M_parent = 1;
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)&analysis.field_0x8);
      }
      p_Var5 = (_Rb_tree_node_base *)analysis._24_8_;
      if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
        p_Var10 = (_Rb_tree_node_base *)analysis._24_8_;
        do {
          pmVar9 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_1d0,*(key_type **)(p_Var10 + 1));
          p_Var11 = (pmVar9->_M_h)._M_before_begin._M_nxt;
          if (p_Var11 != (_Hash_node_base *)0x0) {
            do {
              calledByCalled.super_IString.str._M_str =
                   (char *)Module::getFunction((Module *)analysis._48_8_,
                                               (IString)*(IString *)&p_Var11[1]._M_nxt);
              pmVar8 = std::
                       map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                       ::operator[]((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                                     *)&analysis,
                                    (key_type *)&calledByCalled.super_IString.str._M_str);
              if ((pmVar8->effects).super__Optional_base<wasm::EffectAnalyzer,_false,_false>.
                  _M_payload.super__Optional_payload<wasm::EffectAnalyzer,_true,_false,_false>.
                  super__Optional_payload_base<wasm::EffectAnalyzer>._M_engaged != false) {
                if (*(char *)&p_Var10[0xc]._M_parent == '\0') {
                  std::_Optional_payload_base<wasm::EffectAnalyzer>::_M_destroy
                            ((_Optional_payload_base<wasm::EffectAnalyzer> *)pmVar8);
                }
                else {
                  EffectAnalyzer::mergeIn
                            ((EffectAnalyzer *)pmVar8,(EffectAnalyzer *)&p_Var10[1]._M_parent);
                }
              }
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          p_Var5 = (_Rb_tree_node_base *)analysis._24_8_;
        } while (p_Var10 != (_Rb_tree_node_base *)&analysis.field_0x8);
      }
      if (p_Var5 != (_Rb_tree_node_base *)&analysis.field_0x8) {
        do {
          lVar1 = *(long *)(p_Var5 + 1);
          *(undefined8 *)(lVar1 + 0x1c0) = 0;
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x1c8);
          *(undefined8 *)(lVar1 + 0x1c8) = 0;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (*(char *)&p_Var5[0xc]._M_parent == '\x01') {
            calledByCalled.super_IString.str._M_str = (char *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>,wasm::EffectAnalyzer&>
                      (&_Stack_50,(EffectAnalyzer **)&calledByCalled.super_IString.str._M_str,
                       (allocator<wasm::EffectAnalyzer> *)&module_local,
                       (EffectAnalyzer *)&p_Var5[1]._M_parent);
            _Var4._M_pi = _Stack_50._M_pi;
            pcVar3 = calledByCalled.super_IString.str._M_str;
            lVar1 = *(long *)(p_Var5 + 1);
            calledByCalled.super_IString.str._M_str = (char *)0x0;
            _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x1c8);
            *(char **)(lVar1 + 0x1c0) = pcVar3;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x1c8) = _Var4._M_pi;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               _Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
            }
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)&analysis.field_0x8);
      }
      std::
      _Hashtable<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::pair<wasm::Name,_wasm::Name>,_std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)((long)&work.data.c.
                               super__Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      std::
      _Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
      ::~_Deque_base((_Deque_base<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>
                      *)&callers._M_h._M_single_bucket);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_1d0);
      std::
      _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_FuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_FuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
      ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_FuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_FuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                   *)&analysis);
      return;
    }
    UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::pop
              ((pair<wasm::Name,_wasm::Name> *)__return_storage_ptr__,
               (UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)
               &callers._M_h._M_single_bucket);
    p_Var6 = &std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)local_1d0,(key_type *)&local_48)->_M_h;
    sVar7 = std::
            _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count(p_Var6,(key_type *)__return_storage_ptr__);
    if (sVar7 != 0) break;
    module_local = (Module *)
                   std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_1d0,(key_type *)&local_48);
    std::
    _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
              ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)module_local,__return_storage_ptr__,(key_type *)&module_local);
    module_local = (Module *)Module::getFunction((Module *)analysis._48_8_,(Name)local_48);
    pmVar8 = std::
             map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
             ::operator[]((map<wasm::Function_*,_FuncInfo,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_FuncInfo>_>_>
                           *)&analysis,(key_type *)&module_local);
    for (p_Var11 = (pmVar8->calledFunctions)._M_h._M_before_begin._M_nxt;
        p_Var11 != (_Hash_node_base *)0x0; p_Var11 = p_Var11->_M_nxt) {
      module_local = (Module *)p_Var11[1]._M_nxt;
      calledByCalled.super_IString.str._M_len = (size_t)p_Var11[2]._M_nxt;
      p_Var6 = &std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_1d0,(key_type *)&module_local)->_M_h;
      sVar7 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(p_Var6,(key_type *)__return_storage_ptr__);
      if (sVar7 == 0) {
        local_d8 = SUB84(module_local,0);
        uStack_d4 = (undefined4)((ulong)module_local >> 0x20);
        uStack_d0 = (undefined4)calledByCalled.super_IString.str._M_len;
        uStack_cc = (undefined4)(calledByCalled.super_IString.str._M_len >> 0x20);
        item_00.first.super_IString.str._M_str = (char *)_Stack_50._M_pi;
        item_00.first.super_IString.str._M_len = (size_t)calledByCalled.super_IString.str._M_str;
        item_00.second.super_IString.str._M_len._0_4_ = local_d8;
        item_00.second.super_IString.str._M_len._4_4_ = uStack_d4;
        item_00.second.super_IString.str._M_str._0_4_ = uStack_d0;
        item_00.second.super_IString.str._M_str._4_4_ = uStack_cc;
        UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
                  ((UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *)
                   &callers._M_h._M_single_bucket,item_00);
      }
    }
  }
  __assert_fail("!callers[called].count(caller)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GlobalEffects.cpp"
                ,0x82,"virtual void wasm::GenerateGlobalEffects::run(Module *)");
}

Assistant:

void run(Module* module) override {
    // First, we do a scan of each function to see what effects they have,
    // including which functions they call directly (so that we can compute
    // transitive effects later).

    struct FuncInfo {
      // Effects in this function.
      std::optional<EffectAnalyzer> effects;

      // Directly-called functions from this function.
      std::unordered_set<Name> calledFunctions;
    };

    ModuleUtils::ParallelFunctionAnalysis<FuncInfo> analysis(
      *module, [&](Function* func, FuncInfo& funcInfo) {
        if (func->imported()) {
          // Imports can do anything, so we need to assume the worst anyhow,
          // which is the same as not specifying any effects for them in the
          // map (which we do by not setting funcInfo.effects).
          return;
        }

        // Gather the effects.
        funcInfo.effects.emplace(getPassOptions(), *module, func);

        if (funcInfo.effects->calls) {
          // There are calls in this function, which we will analyze in detail.
          // Clear the |calls| field first, and we'll handle calls of all sorts
          // below.
          funcInfo.effects->calls = false;

          // Clear throws as well, as we are "forgetting" calls right now, and
          // want to forget their throwing effect as well. If we see something
          // else that throws, below, then we'll note that there.
          funcInfo.effects->throws_ = false;

          struct CallScanner
            : public PostWalker<CallScanner,
                                UnifiedExpressionVisitor<CallScanner>> {
            Module& wasm;
            PassOptions& options;
            FuncInfo& funcInfo;

            CallScanner(Module& wasm, PassOptions& options, FuncInfo& funcInfo)
              : wasm(wasm), options(options), funcInfo(funcInfo) {}

            void visitExpression(Expression* curr) {
              ShallowEffectAnalyzer effects(options, wasm, curr);
              if (auto* call = curr->dynCast<Call>()) {
                // Note the direct call.
                funcInfo.calledFunctions.insert(call->target);
              } else if (effects.calls) {
                // This is an indirect call of some sort, so we must assume the
                // worst. To do so, clear the effects, which indicates nothing
                // is known (so anything is possible).
                // TODO: We could group effects by function type etc.
                funcInfo.effects.reset();
              } else {
                // No call here, but update throwing if we see it. (Only do so,
                // however, if we have effects; if we cleared it - see before -
                // then we assume the worst anyhow, and have nothing to update.)
                if (effects.throws_ && funcInfo.effects) {
                  funcInfo.effects->throws_ = true;
                }
              }
            }
          };
          CallScanner scanner(*module, getPassOptions(), funcInfo);
          scanner.walkFunction(func);
        }
      });

    // Compute the transitive closure of effects. To do so, first construct for
    // each function a list of the functions that it is called by (so we need to
    // propogate its effects to them), and then we'll construct the closure of
    // that.
    //
    // callers[foo] = [func that calls foo, another func that calls foo, ..]
    //
    std::unordered_map<Name, std::unordered_set<Name>> callers;

    // Our work queue contains info about a new call pair: a call from a caller
    // to a called function, that is information we then apply and propagate.
    using CallPair = std::pair<Name, Name>; // { caller, called }
    UniqueDeferredQueue<CallPair> work;
    for (auto& [func, info] : analysis.map) {
      for (auto& called : info.calledFunctions) {
        work.push({func->name, called});
      }
    }

    // Compute the transitive closure of the call graph, that is, fill out
    // |callers| so that it contains the list of all callers - even through a
    // chain - of each function.
    while (!work.empty()) {
      auto [caller, called] = work.pop();

      // We must not already have an entry for this call (that would imply we
      // are doing wasted work).
      assert(!callers[called].count(caller));

      // Apply the new call information.
      callers[called].insert(caller);

      // We just learned that |caller| calls |called|. It also calls
      // transitively, which we need to propagate to all places unaware of that
      // information yet.
      //
      //   caller => called => called by called
      //
      auto& calledInfo = analysis.map[module->getFunction(called)];
      for (auto calledByCalled : calledInfo.calledFunctions) {
        if (!callers[calledByCalled].count(caller)) {
          work.push({caller, calledByCalled});
        }
      }
    }

    // Now that we have transitively propagated all static calls, apply that
    // information. First, apply infinite recursion: if a function can call
    // itself then it might recurse infinitely, which we consider an effect (a
    // trap).
    for (auto& [func, info] : analysis.map) {
      if (callers[func->name].count(func->name)) {
        if (info.effects) {
          info.effects->trap = true;
        }
      }
    }

    // Next, apply function effects to their callers.
    for (auto& [func, info] : analysis.map) {
      auto& funcEffects = info.effects;

      for (auto& caller : callers[func->name]) {
        auto& callerEffects = analysis.map[module->getFunction(caller)].effects;
        if (!callerEffects) {
          // Nothing is known for the caller, which is already the worst case.
          continue;
        }

        if (!funcEffects) {
          // Nothing is known for the called function, which means nothing is
          // known for the caller either.
          callerEffects.reset();
          continue;
        }

        // Add func's effects to the caller.
        callerEffects->mergeIn(*funcEffects);
      }
    }

    // Generate the final data, starting from a blank slate where nothing is
    // known.
    for (auto& [func, info] : analysis.map) {
      func->effects.reset();
      if (!info.effects) {
        continue;
      }

      func->effects = std::make_shared<EffectAnalyzer>(*info.effects);
    }
  }